

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O3

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  char cVar1;
  int iVar2;
  int iVar3;
  CompressorScheme CVar4;
  ChannelData *pCVar5;
  exr_coding_channel_info_t *peVar6;
  uint8_t *puVar7;
  int i;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  uint8_t *puVar14;
  long lVar15;
  long alStack_48 [3];
  uint8_t *planarUncBuffer [3];
  
  lVar9 = 0;
  do {
    alStack_48[lVar9] = (long)me->_planarUncBuffer[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  uVar8 = me->_numChannels;
  lVar9 = (long)(int)uVar8;
  if (0 < lVar9) {
    lVar11 = 0x200;
    lVar12 = 0;
    do {
      pCVar5 = me->_channelData;
      peVar6 = pCVar5[lVar12].chan;
      iVar2 = peVar6->width;
      iVar3 = peVar6->height;
      cVar1 = peVar6->bytes_per_element;
      lVar15 = (long)cVar1;
      sVar13 = (long)iVar3 * (long)iVar2 * lVar15;
      pCVar5[lVar12].planarUncSize = sVar13;
      CVar4 = pCVar5[lVar12].compression;
      puVar7 = (uint8_t *)alStack_48[CVar4];
      pCVar5[lVar12].planarUncBuffer = puVar7;
      pCVar5[lVar12].planarUncBufferEnd = puVar7;
      pCVar5[lVar12].planarUncRle[0] = puVar7;
      pCVar5[lVar12].planarUncRleEnd[0] = puVar7;
      if (puVar7 == (uint8_t *)0x0) {
        if ('\x01' < cVar1) {
          lVar10 = 0;
          do {
            *(undefined8 *)((long)(pCVar5->_dctData)._dctData + lVar10 * 8 + lVar11 + -0x20) = 0;
            *(undefined8 *)((long)(pCVar5->_dctData)._dctData + lVar10 * 8 + lVar11) = 0;
            lVar10 = lVar10 + 1;
          } while (lVar15 + -1 != lVar10);
        }
      }
      else if ('\x01' < cVar1) {
        lVar10 = 0;
        puVar14 = puVar7;
        do {
          puVar14 = puVar14 + iVar3 * iVar2;
          *(uint8_t **)((long)(pCVar5->_dctData)._dctData + lVar10 * 8 + lVar11 + -0x20) = puVar14;
          *(uint8_t **)((long)(pCVar5->_dctData)._dctData + lVar10 * 8 + lVar11) = puVar14;
          lVar10 = lVar10 + 1;
        } while (lVar15 + -1 != lVar10);
      }
      uVar8 = (uint)peVar6->data_type;
      pCVar5[lVar12].planarUncType = (uint)peVar6->data_type;
      if (CVar4 == LOSSY_DCT) {
        pCVar5[lVar12].planarUncType = EXR_PIXEL_FLOAT;
      }
      else {
        alStack_48[CVar4] = (long)(puVar7 + sVar13);
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x240;
    } while (lVar12 != lVar9);
  }
  return uVar8;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (int c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        if (!cd->planarUncBuffer)
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte]    = 0;
                cd->planarUncRleEnd[byte] = 0;
            }
        }
        else
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte] =
                    cd->planarUncRle[byte - 1] + curc->width * curc->height;

                cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
            }
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}